

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_guarded.hpp
# Opt level: O0

atomic_guarded<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::mutex>
* __thiscall
gmlc::libguarded::atomic_guarded<std::__cxx11::string,std::mutex>::operator=
          (atomic_guarded<std::__cxx11::string,std::mutex> *this,char (*newObj) [19])

{
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> glock;
  char (*newObj_local) [19];
  atomic_guarded<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::mutex>
  *this_local;
  
  glock._M_device = (mutex_type *)newObj;
  std::lock_guard<std::mutex>::lock_guard(&local_20,(mutex_type *)(this + 0x20));
  std::__cxx11::string::operator=((string *)this,(char *)glock._M_device);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return (atomic_guarded<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::mutex>
          *)this;
}

Assistant:

atomic_guarded& operator=(objType&& newObj)
    {  // uses a forwarding reference
        std::lock_guard<M> glock(m_mutex);
        m_obj = std::forward<objType>(newObj);
        return *this;
    }